

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O3

void fs_write_multiple_bufs(int add_flags)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  __off64_t _Var4;
  undefined8 uVar5;
  void *pvVar6;
  void *pvVar7;
  undefined8 extraout_RAX;
  char *pcVar8;
  long unaff_R12;
  ulong uVar9;
  long lVar10;
  void *pvVar11;
  char *pcVar12;
  undefined1 auVar13 [16];
  uv_buf_t uVar14;
  undefined1 auStack_c2 [2];
  code *pcStack_c0;
  undefined8 uStack_b8;
  void *pvStack_b0;
  long lStack_a8;
  undefined1 local_38 [16];
  undefined1 local_28 [16];
  
  unlink("test_file");
  loop = (uv_loop_t *)uv_default_loop();
  iVar3 = 0;
  iVar2 = uv_fs_open(0,&open_req1,"test_file",0x41,0x180,0);
  if (iVar2 < 0) {
    fs_write_multiple_bufs_cold_1();
LAB_0015864c:
    fs_write_multiple_bufs_cold_2();
LAB_00158651:
    fs_write_multiple_bufs_cold_3();
LAB_00158656:
    fs_write_multiple_bufs_cold_4();
LAB_0015865b:
    fs_write_multiple_bufs_cold_5();
LAB_00158660:
    fs_write_multiple_bufs_cold_6();
LAB_00158665:
    fs_write_multiple_bufs_cold_7();
LAB_0015866a:
    fs_write_multiple_bufs_cold_8();
LAB_0015866f:
    fs_write_multiple_bufs_cold_9();
LAB_00158674:
    fs_write_multiple_bufs_cold_10();
LAB_00158679:
    fs_write_multiple_bufs_cold_11();
LAB_0015867e:
    fs_write_multiple_bufs_cold_12();
LAB_00158683:
    fs_write_multiple_bufs_cold_13();
LAB_00158688:
    fs_write_multiple_bufs_cold_14();
LAB_0015868d:
    fs_write_multiple_bufs_cold_15();
LAB_00158692:
    fs_write_multiple_bufs_cold_16();
LAB_00158697:
    fs_write_multiple_bufs_cold_19();
LAB_0015869c:
    fs_write_multiple_bufs_cold_20();
LAB_001586a1:
    fs_write_multiple_bufs_cold_21();
LAB_001586a6:
    fs_write_multiple_bufs_cold_22();
LAB_001586ab:
    fs_write_multiple_bufs_cold_23();
LAB_001586b0:
    fs_write_multiple_bufs_cold_24();
LAB_001586b5:
    fs_write_multiple_bufs_cold_25();
LAB_001586ba:
    fs_write_multiple_bufs_cold_17();
  }
  else {
    if (open_req1.result._4_4_ < 0) goto LAB_0015864c;
    uv_fs_req_cleanup(&open_req1);
    local_38 = uv_buf_init(test_buf,0xd);
    local_28 = uv_buf_init(test_buf2,0xf);
    iVar3 = 0;
    iVar2 = uv_fs_write(0,&write_req,(int)open_req1.result,local_38,2,0);
    if (iVar2 < 0) goto LAB_00158651;
    if (write_req.result < 0) goto LAB_00158656;
    uv_fs_req_cleanup();
    iVar3 = 0;
    iVar2 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar2 != 0) goto LAB_0015865b;
    if (close_req.result != 0) goto LAB_00158660;
    uv_fs_req_cleanup();
    iVar3 = 0;
    iVar2 = uv_fs_open(0,&open_req1,"test_file",0,0,0);
    if (iVar2 < 0) goto LAB_00158665;
    if (open_req1.result._4_4_ < 0) goto LAB_0015866a;
    uv_fs_req_cleanup(&open_req1);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    buf2[0] = '\0';
    buf2[1] = '\0';
    buf2[2] = '\0';
    buf2[3] = '\0';
    buf2[4] = '\0';
    buf2[5] = '\0';
    buf2[6] = '\0';
    buf2[7] = '\0';
    buf2[8] = '\0';
    buf2[9] = '\0';
    buf2[10] = '\0';
    buf2[0xb] = '\0';
    buf2[0xc] = '\0';
    buf2[0xd] = '\0';
    buf2[0xe] = '\0';
    buf2[0xf] = '\0';
    buf2[0x10] = '\0';
    buf2[0x11] = '\0';
    buf2[0x12] = '\0';
    buf2[0x13] = '\0';
    buf2[0x14] = '\0';
    buf2[0x15] = '\0';
    buf2[0x16] = '\0';
    buf2[0x17] = '\0';
    buf2[0x18] = '\0';
    buf2[0x19] = '\0';
    buf2[0x1a] = '\0';
    buf2[0x1b] = '\0';
    buf2[0x1c] = '\0';
    buf2[0x1d] = '\0';
    buf2[0x1e] = '\0';
    buf2[0x1f] = '\0';
    auVar13 = uv_buf_init(buf,0xd);
    local_38 = auVar13;
    auVar13 = uv_buf_init(buf2);
    iVar3 = (int)open_req1.result;
    local_28 = auVar13;
    _Var4 = lseek64((int)open_req1.result,0,1);
    if (_Var4 != 0) goto LAB_0015866f;
    iVar3 = 0;
    iVar2 = uv_fs_read(0,&read_req,(int)open_req1.result,local_38,2,0xffffffffffffffff);
    if (iVar2 < 0) goto LAB_00158674;
    if (read_req.result != 0x1c) goto LAB_00158679;
    iVar3 = 0x2e3070;
    iVar2 = strcmp(buf,test_buf);
    if (iVar2 != 0) goto LAB_0015867e;
    iVar3 = 0x2e4460;
    iVar2 = strcmp(buf2,test_buf2);
    if (iVar2 != 0) goto LAB_00158683;
    uv_fs_req_cleanup(&read_req);
    iov = (uv_buf_t)uv_buf_init(buf,0x20);
    iVar3 = 0;
    iVar2 = uv_fs_read(0,&read_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    if (iVar2 != 0) goto LAB_00158688;
    if (read_req.result != 0) goto LAB_0015868d;
    uv_fs_req_cleanup(&read_req);
    auVar13 = uv_buf_init(buf,0xd);
    local_38 = auVar13;
    auVar13 = uv_buf_init(buf2,0xf);
    iVar3 = 0;
    local_28 = auVar13;
    iVar2 = uv_fs_read(0,&read_req,(int)open_req1.result,local_38,2,0);
    if (iVar2 < 0) goto LAB_00158692;
    if (read_req.result == 0x1c) {
LAB_0015854a:
      iVar3 = 0x2e3070;
      iVar2 = strcmp(buf,test_buf);
      if (iVar2 != 0) goto LAB_00158697;
      iVar3 = 0x2e4460;
      iVar2 = strcmp(buf2,test_buf2);
      if (iVar2 != 0) goto LAB_0015869c;
      uv_fs_req_cleanup(&read_req);
      uVar14 = (uv_buf_t)uv_buf_init(buf,0x20);
      iVar3 = 0;
      iov = uVar14;
      iVar2 = uv_fs_read(0,&read_req,(int)open_req1.result,&iov,1,0x1c);
      if (iVar2 != 0) goto LAB_001586a1;
      if (read_req.result != 0) goto LAB_001586a6;
      uv_fs_req_cleanup();
      iVar3 = 0;
      iVar2 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
      if (iVar2 != 0) goto LAB_001586ab;
      if (close_req.result == 0) {
        uv_fs_req_cleanup(&close_req);
        unlink("test_file");
        return;
      }
      goto LAB_001586b0;
    }
    if (read_req.result != 0xd) goto LAB_001586b5;
    uv_fs_req_cleanup();
    iVar3 = 0;
    iVar2 = uv_fs_read(0,&read_req,(int)open_req1.result,local_28,1,read_req.result);
    if (iVar2 < 0) goto LAB_001586ba;
    if (read_req.result == 0xf) goto LAB_0015854a;
  }
  fs_write_multiple_bufs_cold_18();
  fs_write_alotof_bufs(iVar3);
  fs_write_alotof_bufs(iVar3);
  uVar5 = uv_default_loop();
  uv_walk(uVar5,close_walk_cb,0);
  uv_run(uVar5,0);
  uVar5 = uv_default_loop();
  iVar3 = uv_loop_close(uVar5);
  if (iVar3 == 0) {
    return;
  }
  run_test_fs_write_alotof_bufs_cold_1();
  unlink("test_file");
  loop = (uv_loop_t *)uv_default_loop();
  iVar3 = 0xd4310;
  pvVar6 = malloc(0xd4310);
  if (pvVar6 == (void *)0x0) {
LAB_00158a3c:
    fs_write_alotof_bufs_cold_18();
LAB_00158a41:
    fs_write_alotof_bufs_cold_1();
LAB_00158a46:
    fs_write_alotof_bufs_cold_2();
LAB_00158a4b:
    fs_write_alotof_bufs_cold_3();
LAB_00158a50:
    fs_write_alotof_bufs_cold_4();
LAB_00158a55:
    fs_write_alotof_bufs_cold_17();
LAB_00158a5a:
    fs_write_alotof_bufs_cold_5();
LAB_00158a5f:
    fs_write_alotof_bufs_cold_6();
LAB_00158a64:
    fs_write_alotof_bufs_cold_7();
LAB_00158a69:
    fs_write_alotof_bufs_cold_8();
LAB_00158a6e:
    fs_write_alotof_bufs_cold_9();
LAB_00158a73:
    fs_write_alotof_bufs_cold_10();
LAB_00158a78:
    fs_write_alotof_bufs_cold_12();
LAB_00158a7d:
    fs_write_alotof_bufs_cold_13();
LAB_00158a82:
    fs_write_alotof_bufs_cold_14();
LAB_00158a87:
    fs_write_alotof_bufs_cold_15();
  }
  else {
    iVar3 = 0;
    iVar2 = uv_fs_open(0,&open_req1,"test_file",0x42,0x180,0);
    if (iVar2 < 0) goto LAB_00158a41;
    if (open_req1.result._4_4_ < 0) goto LAB_00158a46;
    uv_fs_req_cleanup(&open_req1);
    lVar10 = 8;
    do {
      auVar13 = uv_buf_init(test_buf,0xd);
      *(long *)((long)pvVar6 + lVar10 + -8) = auVar13._0_8_;
      *(long *)((long)pvVar6 + lVar10) = auVar13._8_8_;
      lVar10 = lVar10 + 0x10;
    } while (lVar10 != 0xd4318);
    iVar3 = 0;
    iVar2 = uv_fs_write(0,&write_req,(int)open_req1.result,pvVar6,0xd431,0xffffffffffffffff);
    if (iVar2 < 0) goto LAB_00158a4b;
    if (write_req.result != 0xac67d) goto LAB_00158a50;
    uv_fs_req_cleanup(&write_req);
    iVar3 = 0xac67d;
    pvVar7 = malloc(0xac67d);
    if (pvVar7 == (void *)0x0) goto LAB_00158a55;
    lVar10 = 8;
    pvVar11 = pvVar7;
    do {
      auVar13 = uv_buf_init(pvVar11,0xd);
      *(long *)((long)pvVar6 + lVar10 + -8) = auVar13._0_8_;
      *(long *)((long)pvVar6 + lVar10) = auVar13._8_8_;
      lVar10 = lVar10 + 0x10;
      pvVar11 = (void *)((long)pvVar11 + 0xd);
    } while (lVar10 != 0xd4318);
    iVar3 = 0;
    iVar2 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    unaff_R12 = 0xd4318;
    if (iVar2 != 0) goto LAB_00158a5a;
    if (close_req.result != 0) goto LAB_00158a5f;
    uv_fs_req_cleanup();
    iVar3 = 0;
    iVar2 = uv_fs_open(0,&open_req1,"test_file",0,0,0);
    if (iVar2 < 0) goto LAB_00158a64;
    if (open_req1.result._4_4_ < 0) goto LAB_00158a69;
    uv_fs_req_cleanup();
    iVar3 = 0;
    iVar2 = uv_fs_read(0,&read_req,(int)open_req1.result,pvVar6,0xd431,0xffffffffffffffff);
    if (iVar2 < 0) goto LAB_00158a6e;
    if (read_req.result != 0x3400) goto LAB_00158a73;
    unaff_R12 = 0;
    do {
      pcVar8 = (char *)((long)pvVar7 + unaff_R12);
      iVar2 = strncmp(pcVar8,test_buf,0xd);
      iVar3 = (int)pcVar8;
      if (iVar2 != 0) {
        fs_write_alotof_bufs_cold_11();
        goto LAB_00158a3c;
      }
      unaff_R12 = unaff_R12 + 0xd;
    } while (unaff_R12 != 0x3400);
    uv_fs_req_cleanup(&read_req);
    free(pvVar7);
    iVar3 = (int)open_req1.result;
    _Var4 = lseek64((int)open_req1.result,write_req.result,0);
    if (_Var4 != write_req.result) goto LAB_00158a78;
    uVar14 = (uv_buf_t)uv_buf_init(buf,0x20);
    iVar3 = 0;
    iov = uVar14;
    iVar2 = uv_fs_read(0,&read_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    if (iVar2 != 0) goto LAB_00158a7d;
    if (read_req.result != 0) goto LAB_00158a82;
    uv_fs_req_cleanup();
    iVar3 = 0;
    iVar2 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar2 != 0) goto LAB_00158a87;
    if (close_req.result == 0) {
      uv_fs_req_cleanup(&close_req);
      unlink("test_file");
      free(pvVar6);
      return;
    }
  }
  fs_write_alotof_bufs_cold_16();
  fs_write_alotof_bufs_with_offset(iVar3);
  fs_write_alotof_bufs_with_offset(iVar3);
  pvVar6 = (void *)uv_default_loop();
  uv_walk(pvVar6,close_walk_cb,0);
  uv_run(pvVar6,0);
  uVar5 = uv_default_loop();
  iVar3 = uv_loop_close(uVar5);
  if (iVar3 == 0) {
    return;
  }
  run_test_fs_write_alotof_bufs_with_offset_cold_1();
  pcStack_c0 = (code *)0x158af0;
  uStack_b8 = extraout_RAX;
  pvStack_b0 = pvVar6;
  lStack_a8 = unaff_R12;
  unlink("test_file");
  pcStack_c0 = (code *)0x158af5;
  loop = (uv_loop_t *)uv_default_loop();
  pcStack_c0 = (code *)0x158b06;
  pvVar7 = malloc(0xd4310);
  if (pvVar7 == (void *)0x0) {
LAB_00158e4b:
    pvVar7 = pvVar6;
    pcStack_c0 = (code *)0x158e50;
    fs_write_alotof_bufs_with_offset_cold_17();
LAB_00158e50:
    pcStack_c0 = (code *)0x158e55;
    fs_write_alotof_bufs_with_offset_cold_1();
LAB_00158e55:
    pcStack_c0 = (code *)0x158e5a;
    fs_write_alotof_bufs_with_offset_cold_2();
LAB_00158e5a:
    pcStack_c0 = (code *)0x158e5f;
    fs_write_alotof_bufs_with_offset_cold_3();
LAB_00158e5f:
    pcStack_c0 = (code *)0x158e64;
    fs_write_alotof_bufs_with_offset_cold_4();
LAB_00158e64:
    pcStack_c0 = (code *)0x158e69;
    fs_write_alotof_bufs_with_offset_cold_5();
LAB_00158e69:
    pcStack_c0 = (code *)0x158e6e;
    fs_write_alotof_bufs_with_offset_cold_6();
LAB_00158e6e:
    pcStack_c0 = (code *)0x158e73;
    fs_write_alotof_bufs_with_offset_cold_16();
LAB_00158e73:
    pcStack_c0 = (code *)0x158e78;
    fs_write_alotof_bufs_with_offset_cold_7();
LAB_00158e78:
    pcStack_c0 = (code *)0x158e7d;
    fs_write_alotof_bufs_with_offset_cold_8();
LAB_00158e7d:
    pcStack_c0 = (code *)0x158e82;
    fs_write_alotof_bufs_with_offset_cold_10();
LAB_00158e82:
    pcStack_c0 = (code *)0x158e87;
    fs_write_alotof_bufs_with_offset_cold_11();
LAB_00158e87:
    pcStack_c0 = (code *)0x158e8c;
    fs_write_alotof_bufs_with_offset_cold_12();
LAB_00158e8c:
    pcStack_c0 = (code *)0x158e91;
    fs_write_alotof_bufs_with_offset_cold_13();
LAB_00158e91:
    pcStack_c0 = (code *)0x158e96;
    fs_write_alotof_bufs_with_offset_cold_14();
  }
  else {
    pcStack_c0 = (code *)0x158b35;
    iVar3 = uv_fs_open(0,&open_req1,"test_file",0x42,0x180,0);
    if (iVar3 < 0) goto LAB_00158e50;
    if (open_req1.result._4_4_ < 0) goto LAB_00158e55;
    pcStack_c0 = (code *)0x158b57;
    uv_fs_req_cleanup(&open_req1);
    pcStack_c0 = (code *)0x158b68;
    uVar14 = (uv_buf_t)uv_buf_init("0123456789",10);
    uStack_b8 = 0;
    pcStack_c0 = (code *)0x158ba6;
    iov = uVar14;
    iVar3 = uv_fs_write(0,&write_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    if (iVar3 != 10) goto LAB_00158e5a;
    if (write_req.result != 10) goto LAB_00158e5f;
    pcStack_c0 = (code *)0x158bc9;
    uv_fs_req_cleanup(&write_req);
    lVar10 = 8;
    do {
      pcStack_c0 = (code *)0x158be3;
      auVar13 = uv_buf_init(test_buf,0xd);
      *(long *)((long)pvVar7 + lVar10 + -8) = auVar13._0_8_;
      *(long *)((long)pvVar7 + lVar10) = auVar13._8_8_;
      lVar10 = lVar10 + 0x10;
    } while (lVar10 != 0xd4318);
    uStack_b8 = 0;
    pcStack_c0 = (code *)0x158c24;
    iVar3 = uv_fs_write(0,&write_req,(int)open_req1.result,pvVar7,0xd431,10);
    if (iVar3 < 0) goto LAB_00158e64;
    if (write_req.result != 0xac67d) goto LAB_00158e69;
    pcStack_c0 = (code *)0x158c49;
    uv_fs_req_cleanup(&write_req);
    pcStack_c0 = (code *)0x158c53;
    pcVar8 = (char *)malloc(0xac67d);
    if (pcVar8 == (char *)0x0) goto LAB_00158e6e;
    lVar10 = 8;
    pcVar12 = pcVar8;
    do {
      pcStack_c0 = (code *)0x158c75;
      auVar13 = uv_buf_init(pcVar12,0xd);
      *(long *)((long)pvVar7 + lVar10 + -8) = auVar13._0_8_;
      *(long *)((long)pvVar7 + lVar10) = auVar13._8_8_;
      lVar10 = lVar10 + 0x10;
      pcVar12 = pcVar12 + 0xd;
    } while (lVar10 != 0xd4318);
    uStack_b8 = 0;
    pcStack_c0 = (code *)0x158cba;
    iVar3 = uv_fs_read(0,&read_req,(int)open_req1.result,pvVar7,0xd431,10);
    if (iVar3 < 0) goto LAB_00158e73;
    lVar10 = 0xd;
    if (iVar3 != 0xd) {
      lVar10 = 0x3400;
    }
    if (read_req.result != lVar10) goto LAB_00158e78;
    pcVar12 = pcVar8;
    uVar9 = 0;
    do {
      pcStack_c0 = (code *)0x158cff;
      iVar2 = strncmp(pcVar12,test_buf,0xd);
      if (iVar2 != 0) {
        pcStack_c0 = (code *)0x158e4b;
        fs_write_alotof_bufs_with_offset_cold_9();
        pvVar6 = pvVar7;
        goto LAB_00158e4b;
      }
      if (iVar3 == 0xd) break;
      pcVar12 = pcVar12 + 0xd;
      bVar1 = uVar9 < 0x3ff;
      uVar9 = uVar9 + 1;
    } while (bVar1);
    pcStack_c0 = (code *)0x158d2c;
    uv_fs_req_cleanup(&read_req);
    pcStack_c0 = (code *)0x158d34;
    free(pcVar8);
    pcStack_c0 = (code *)0x158d4b;
    iVar3 = uv_fs_stat(0,&stat_req,"test_file",0);
    if (iVar3 != 0) goto LAB_00158e7d;
    if (*(long *)((long)stat_req.ptr + 0x38) != write_req.result + 10) goto LAB_00158e82;
    pcStack_c0 = (code *)0x158d7b;
    uv_fs_req_cleanup(&stat_req);
    pcStack_c0 = (code *)0x158d8c;
    uVar14 = (uv_buf_t)uv_buf_init(buf,0x20);
    uStack_b8 = 0;
    pcStack_c0 = (code *)0x158dce;
    iov = uVar14;
    iVar3 = uv_fs_read(0,&read_req,(int)open_req1.result,&iov,1,write_req.result + 10);
    if (iVar3 != 0) goto LAB_00158e87;
    if (read_req.result != 0) goto LAB_00158e8c;
    pcStack_c0 = (code *)0x158df0;
    uv_fs_req_cleanup(&read_req);
    pcStack_c0 = (code *)0x158e06;
    iVar3 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar3 != 0) goto LAB_00158e91;
    if (close_req.result == 0) {
      pcStack_c0 = (code *)0x158e24;
      uv_fs_req_cleanup(&close_req);
      pcStack_c0 = (code *)0x158e30;
      unlink("test_file");
      free(pvVar7);
      return;
    }
  }
  pcStack_c0 = run_test_fs_read_dir;
  fs_write_alotof_bufs_with_offset_cold_15();
  pcStack_c0 = (code *)pvVar7;
  loop = (uv_loop_t *)uv_default_loop();
  rmdir("test_dir");
  iVar3 = uv_fs_mkdir(loop,&mkdir_req,"test_dir",0x1ed,mkdir_cb);
  if (iVar3 == 0) {
    uv_run(loop,0);
    if (mkdir_cb_count != 1) goto LAB_0015900d;
    iVar3 = uv_fs_open(loop,&open_req1,"test_dir",0x10000,0x180,0);
    if (iVar3 < 0) goto LAB_00159012;
    uv_fs_req_cleanup(&open_req1);
    uVar14 = (uv_buf_t)uv_buf_init(auStack_c2,2);
    iov = uVar14;
    iVar3 = uv_fs_read(0,&read_req,(int)open_req1.result,&iov,1,0,0);
    if (iVar3 != -0x15) goto LAB_00159017;
    uv_fs_req_cleanup(&read_req);
    iVar3 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar3 == 0) {
      uv_fs_req_cleanup(&close_req);
      rmdir("test_dir");
      uVar5 = uv_default_loop();
      uv_walk(uVar5,close_walk_cb,0);
      uv_run(uVar5,0);
      uVar5 = uv_default_loop();
      iVar3 = uv_loop_close(uVar5);
      if (iVar3 == 0) {
        return;
      }
      goto LAB_00159021;
    }
  }
  else {
    run_test_fs_read_dir_cold_1();
LAB_0015900d:
    run_test_fs_read_dir_cold_2();
LAB_00159012:
    run_test_fs_read_dir_cold_3();
LAB_00159017:
    run_test_fs_read_dir_cold_4();
  }
  run_test_fs_read_dir_cold_5();
LAB_00159021:
  run_test_fs_read_dir_cold_6();
  test_fs_partial(1);
  return;
}

Assistant:

static void fs_write_multiple_bufs(int add_flags) {
  uv_buf_t iovs[2];
  int r;

  /* Setup. */
  unlink("test_file");

  loop = uv_default_loop();

  r = uv_fs_open(NULL, &open_req1, "test_file",
      O_WRONLY | O_CREAT | add_flags, S_IWUSR | S_IRUSR, NULL);
  ASSERT(r >= 0);
  ASSERT(open_req1.result >= 0);
  uv_fs_req_cleanup(&open_req1);

  iovs[0] = uv_buf_init(test_buf, sizeof(test_buf));
  iovs[1] = uv_buf_init(test_buf2, sizeof(test_buf2));
  r = uv_fs_write(NULL, &write_req, open_req1.result, iovs, 2, 0, NULL);
  ASSERT(r >= 0);
  ASSERT(write_req.result >= 0);
  uv_fs_req_cleanup(&write_req);

  r = uv_fs_close(NULL, &close_req, open_req1.result, NULL);
  ASSERT(r == 0);
  ASSERT(close_req.result == 0);
  uv_fs_req_cleanup(&close_req);

  r = uv_fs_open(NULL, &open_req1, "test_file", O_RDONLY | add_flags, 0,
      NULL);
  ASSERT(r >= 0);
  ASSERT(open_req1.result >= 0);
  uv_fs_req_cleanup(&open_req1);

  memset(buf, 0, sizeof(buf));
  memset(buf2, 0, sizeof(buf2));
  /* Read the strings back to separate buffers. */
  iovs[0] = uv_buf_init(buf, sizeof(test_buf));
  iovs[1] = uv_buf_init(buf2, sizeof(test_buf2));
  ASSERT(lseek(open_req1.result, 0, SEEK_CUR) == 0);
  r = uv_fs_read(NULL, &read_req, open_req1.result, iovs, 2, -1, NULL);
  ASSERT(r >= 0);
  ASSERT(read_req.result == sizeof(test_buf) + sizeof(test_buf2));
  ASSERT(strcmp(buf, test_buf) == 0);
  ASSERT(strcmp(buf2, test_buf2) == 0);
  uv_fs_req_cleanup(&read_req);

  iov = uv_buf_init(buf, sizeof(buf));
  r = uv_fs_read(NULL, &read_req, open_req1.result, &iov, 1, -1, NULL);
  ASSERT(r == 0);
  ASSERT(read_req.result == 0);
  uv_fs_req_cleanup(&read_req);

  /* Read the strings back to separate buffers. */
  iovs[0] = uv_buf_init(buf, sizeof(test_buf));
  iovs[1] = uv_buf_init(buf2, sizeof(test_buf2));
  r = uv_fs_read(NULL, &read_req, open_req1.result, iovs, 2, 0, NULL);
  ASSERT(r >= 0);
  if (read_req.result == sizeof(test_buf)) {
    /* Infer that preadv is not available. */
    uv_fs_req_cleanup(&read_req);
    r = uv_fs_read(NULL, &read_req, open_req1.result, &iovs[1], 1, read_req.result, NULL);
    ASSERT(r >= 0);
    ASSERT(read_req.result == sizeof(test_buf2));
  } else {
    ASSERT(read_req.result == sizeof(test_buf) + sizeof(test_buf2));
  }
  ASSERT(strcmp(buf, test_buf) == 0);
  ASSERT(strcmp(buf2, test_buf2) == 0);
  uv_fs_req_cleanup(&read_req);

  iov = uv_buf_init(buf, sizeof(buf));
  r = uv_fs_read(NULL, &read_req, open_req1.result, &iov, 1,
                 sizeof(test_buf) + sizeof(test_buf2), NULL);
  ASSERT(r == 0);
  ASSERT(read_req.result == 0);
  uv_fs_req_cleanup(&read_req);

  r = uv_fs_close(NULL, &close_req, open_req1.result, NULL);
  ASSERT(r == 0);
  ASSERT(close_req.result == 0);
  uv_fs_req_cleanup(&close_req);

  /* Cleanup */
  unlink("test_file");
}